

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O2

void Abc_Sort_rec(int *pInBeg,int *pInEnd,int *pOutBeg)

{
  int *pInEnd_00;
  int iVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar8 = (long)pInEnd - (long)pInBeg;
  uVar3 = (uint)(uVar8 >> 2);
  if ((int)uVar3 < 1) {
    __assert_fail("nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilSort.c"
                  ,0x53,"void Abc_Sort_rec(int *, int *, int *)");
  }
  if (uVar3 != 1) {
    if (uVar3 == 2) {
      iVar6 = pInBeg[1];
      if (iVar6 < *pInBeg) {
        pInBeg[1] = *pInBeg;
        *pInBeg = iVar6;
      }
    }
    else {
      if (7 < uVar3) {
        uVar4 = uVar8 >> 1 & 0x1fffffffc;
        pInEnd_00 = (int *)((long)pInBeg + uVar4);
        Abc_Sort_rec(pInBeg,pInEnd_00,pOutBeg);
        Abc_Sort_rec(pInEnd_00,pInEnd,(int *)(uVar4 + (long)pOutBeg));
        Abc_SortMerge(pInBeg,pInEnd_00,pInEnd_00,pInEnd,pOutBeg);
        memcpy(pInBeg,pOutBeg,uVar8 & 0x1fffffffc);
        return;
      }
      uVar8 = 1;
      for (uVar4 = 0; uVar4 != uVar3 - 1; uVar4 = uVar4 + 1) {
        uVar7 = uVar4 & 0xffffffff;
        for (uVar5 = uVar8; iVar6 = (int)uVar7, (int)uVar5 < (int)uVar3; uVar5 = uVar5 + 1) {
          uVar2 = uVar5 & 0xffffffff;
          if (pInBeg[iVar6] <= pInBeg[uVar5]) {
            uVar2 = uVar7;
          }
          uVar7 = uVar2;
        }
        iVar1 = pInBeg[uVar4];
        pInBeg[uVar4] = pInBeg[iVar6];
        pInBeg[iVar6] = iVar1;
        uVar8 = uVar8 + 1;
      }
    }
  }
  return;
}

Assistant:

void Abc_Sort_rec( int * pInBeg, int * pInEnd, int * pOutBeg )
{
    int nSize = pInEnd - pInBeg;
    assert( nSize > 0 );
    if ( nSize == 1 )
        return;
    if ( nSize == 2 )
    {
         if ( pInBeg[0] > pInBeg[1] )
         {
             pInBeg[0] ^= pInBeg[1];
             pInBeg[1] ^= pInBeg[0];
             pInBeg[0] ^= pInBeg[1];
         }
    }
    else if ( nSize < 8 )
    {
        int temp, i, j, best_i;
        for ( i = 0; i < nSize-1; i++ )
        {
            best_i = i;
            for ( j = i+1; j < nSize; j++ )
                if ( pInBeg[j] < pInBeg[best_i] )
                    best_i = j;
            temp = pInBeg[i]; 
            pInBeg[i] = pInBeg[best_i]; 
            pInBeg[best_i] = temp;
        }
    }
    else
    {
        Abc_Sort_rec( pInBeg, pInBeg + nSize/2, pOutBeg );
        Abc_Sort_rec( pInBeg + nSize/2, pInEnd, pOutBeg + nSize/2 );
        Abc_SortMerge( pInBeg, pInBeg + nSize/2, pInBeg + nSize/2, pInEnd, pOutBeg );
        memcpy( pInBeg, pOutBeg, sizeof(int) * nSize );
    }
}